

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O1

void chrono::ChPeriodicPar(double *u,int closed)

{
  if (*u < 0.0) {
    *u = (double)((ulong)(closed != 0) * (long)(*u + 1.0));
  }
  if (1.0 < *u) {
    *u = (double)((ulong)(closed == 0) * 0x3ff0000000000000 +
                 (ulong)(closed != 0) * (long)(*u + -1.0));
  }
  return;
}

Assistant:

void ChPeriodicPar(double& u, int closed) {
    if (u < 0) {
        if (closed)
            u = u + 1;
        else
            u = 0;
    }
    if (u > 1) {
        if (closed)
            u = u - 1;
        else
            u = 1;
    }
}